

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::peekString(XMLReader *this,XMLCh *toPeek)

{
  short *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = 0;
  if (toPeek != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toPeek + uVar6);
      uVar6 = uVar6 + 2;
    } while (*psVar1 != 0);
    uVar6 = ((long)uVar6 >> 1) - 1;
  }
  XVar5 = this->fCharIndex;
  uVar3 = this->fCharsAvail - XVar5;
  do {
    if (uVar6 <= uVar3) {
      iVar2 = bcmp(this->fCharBuf + XVar5,toPeek,uVar6 * 2);
      return iVar2 == 0;
    }
    refreshCharBuffer(this);
    XVar5 = this->fCharIndex;
    uVar4 = this->fCharsAvail - XVar5;
    bVar7 = uVar4 != uVar3;
    uVar3 = uVar4;
  } while (bVar7);
  return false;
}

Assistant:

bool XMLReader::peekString(const XMLCh* const toPeek)
{
    // Get the length of the string to skip
    const XMLSize_t srcLen = XMLString::stringLen(toPeek);

    //
    //  See if the current reader has enough chars to test against this
    //  string. If not, then ask it to reload its buffer. If that does not
    //  get us enough, then it cannot match.
    //
    //  NOTE: This works because strings never have to cross a reader! And
    //  a string to skip will never have a new line in it, so we will never
    //  miss adjusting the current line.
    //
    XMLSize_t charsLeft = charsLeftInBuffer();
    while (charsLeft < srcLen)
    {
         refreshCharBuffer();
         XMLSize_t t = charsLeftInBuffer();
         if (t == charsLeft)   // if the refreshCharBuf() did not add anything new
             return false;     //   give up and return.
         charsLeft = t;
	}




    //
    //  Ok, now we now that the current reader has enough chars in its
    //  buffer and that its index is back at zero. So we can do a quick and
    //  dirty comparison straight to its buffer with no requirement to unget
    //  if it fails.
    //
    if (memcmp(&fCharBuf[fCharIndex], toPeek, srcLen*sizeof(XMLCh)))
        return false;

    return true;
}